

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
ElementsTransactionApi_FundRawTransaction_Reissueasset_Test::TestBody
          (ElementsTransactionApi_FundRawTransaction_Reissueasset_Test *this)

{
  uint32_t uVar1;
  initializer_list<cfd::api::ElementsUtxoAndOption> __l;
  bool bVar2;
  ulong uVar3;
  reference pvVar4;
  string *psVar5;
  char *pcVar6;
  size_type sVar7;
  char *pcVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_bool>
  pVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar10;
  AssertionResult gtest_ar_5;
  CfdException *except;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ConfidentialTransactionController ctx;
  ElementsTransactionApi api;
  CoinSelectionOption option;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  append_txout_addresses;
  UtxoFilter filter;
  Amount estimate_fee;
  double fee_rate;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  selected_txin_utxos;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reserve_txout_address;
  Address addr2;
  Address addr1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  map_target_value;
  ConfidentialAssetId fee_asset;
  Address set_addr2;
  Address set_addr1;
  ExtPubkey key;
  IssuanceOutputParameter reissue_data;
  Address addr;
  Txid txid;
  TestFundElementsUtxoVector *test_data;
  const_iterator __end1;
  const_iterator __begin1;
  vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_> *__range1;
  uint32_t i;
  string descMulti;
  string tokenAsset;
  ElementsAddressFactory factory;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ConfidentialTransactionContext tx;
  ElementsUtxoAndOption input_utxo;
  vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
  *in_stack_ffffffffffffdbc8;
  ElementsUtxoAndOption *in_stack_ffffffffffffdbd0;
  ElementsUtxoAndOption *this_00;
  undefined4 in_stack_ffffffffffffdbd8;
  undefined4 uVar11;
  undefined4 in_stack_ffffffffffffdbdc;
  ElementsUtxoAndOption *in_stack_ffffffffffffdbe0;
  CoinSelectionOption *this_01;
  ElementsUtxoAndOption *in_stack_ffffffffffffdbe8;
  vector *lhs_expression;
  ElementsUtxoAndOption *in_stack_ffffffffffffdbf0;
  allocator_type *in_stack_ffffffffffffdbf8;
  undefined4 in_stack_ffffffffffffdc00;
  undefined4 in_stack_ffffffffffffdc04;
  iterator in_stack_ffffffffffffdc08;
  size_type in_stack_ffffffffffffdc10;
  undefined1 ****local_2330;
  AssertHelper local_2248;
  Message local_2240;
  string local_2238 [32];
  AssertionResult local_2218;
  AssertHelper local_2208;
  Message local_2200;
  string local_21f8 [32];
  AssertionResult local_21d8;
  AssertHelper local_21c8;
  Message local_21c0;
  size_type local_21b8;
  undefined8 local_21b0;
  AssertionResult local_21a8;
  AssertHelper local_2198;
  Message local_2190;
  undefined8 local_2188;
  undefined4 local_217c;
  AssertionResult local_2178;
  AssertHelper local_2168;
  Message local_2160;
  string local_2158 [32];
  AssertionResult local_2138;
  map local_2128 [32];
  string local_2108 [87];
  ElementsTransactionApi local_20b1;
  ConfidentialAssetId local_20b0 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2048;
  vector local_202c [4];
  Amount local_2028 [16];
  double local_2018;
  undefined8 ***local_2008;
  undefined1 ***local_2000 [167];
  undefined8 ***local_1ac8;
  undefined8 local_1ac0;
  ConfidentialAssetId local_1ab8;
  string local_1a90 [32];
  string local_1a70 [32];
  _Base_ptr local_1a50;
  undefined1 local_1a48;
  string local_1a40 [32];
  string local_1a20 [80];
  undefined1 local_19d0 [136];
  Pubkey local_1948 [15];
  undefined1 local_17d0 [136];
  Pubkey local_1748 [15];
  _Base_ptr local_15d0;
  undefined1 local_15c8;
  Amount local_15c0 [16];
  string local_15b0 [32];
  _Base_ptr local_1590;
  undefined1 local_1588;
  Amount local_1580 [16];
  string local_1570 [32];
  map local_1550 [48];
  undefined1 local_1520 [40];
  undefined1 local_14f8 [16];
  ConfidentialAssetId local_14e8 [3];
  Pubkey local_1450 [15];
  undefined1 local_12d8 [136];
  Pubkey local_1250 [15];
  allocator local_10d1;
  string local_10d0 [32];
  ExtPubkey local_10b0;
  allocator local_1039;
  string local_1038 [32];
  BlindFactor local_1018;
  undefined1 local_ff8 [152];
  _func_int **local_f60 [2];
  allocator local_f49;
  string local_f48 [32];
  string local_f28 [376];
  BlindFactor local_db0 [27];
  undefined1 local_a50 [64];
  undefined1 local_a10 [24];
  string local_9f8 [32];
  string local_9d8 [376];
  undefined8 local_860;
  undefined1 local_858;
  allocator local_849;
  string local_848 [32];
  BlindFactor local_828;
  allocator local_801;
  string local_800 [32];
  BlindFactor local_7e0;
  ConfidentialAssetId local_7c0;
  allocator local_791;
  string local_790 [32];
  Txid local_770;
  ConfidentialAssetId local_750;
  undefined8 local_728;
  value_type local_720;
  Txid local_718;
  Txid local_6f8;
  Txid local_6d8;
  reference local_6b8;
  TestFundElementsUtxoVector *local_6b0;
  __normal_iterator<const_TestFundElementsUtxoVector_*,_std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>_>
  local_6a8;
  vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_> *local_6a0;
  uint local_698;
  allocator local_691;
  string local_690 [39];
  allocator local_669;
  string local_668 [32];
  ElementsAddressFactory local_648 [40];
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_620;
  ConfidentialTransactionContext local_5f8 [224];
  Txid local_518;
  uint local_4f8;
  string local_308 [32];
  undefined8 local_2e8;
  undefined1 local_2e0;
  undefined4 local_2d8;
  undefined8 local_2d0;
  ConfidentialAssetId local_2c8 [11];
  BlindFactor local_f0;
  BlindFactor local_d0 [4];
  undefined1 local_50;
  undefined1 local_4f;
  
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption(in_stack_ffffffffffffdbe0);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(local_5f8,2,0);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x2875cf);
  cfd::ElementsAddressFactory::ElementsAddressFactory(local_648,kElementsRegtest);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_668,"ed6927df918c89b5e3d8b5062acab2c749a3291bb7451d4267c7daaf1b52ad0b",&local_669
            );
  std::allocator<char>::~allocator((allocator<char> *)&local_669);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_690,
             "wsh(multi(2,03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7,03774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a))"
             ,&local_691);
  std::allocator<char>::~allocator((allocator<char> *)&local_691);
  std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>::size
            (&kFundCoinSelectElementsTestVector);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::resize
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffdbf0,
             (size_type)in_stack_ffffffffffffdbe8);
  local_698 = 0;
  local_6a0 = &kFundCoinSelectElementsTestVector;
  local_6a8._M_current =
       (TestFundElementsUtxoVector *)
       std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>::begin
                 (in_stack_ffffffffffffdbc8);
  local_6b0 = (TestFundElementsUtxoVector *)
              std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>::
              end(in_stack_ffffffffffffdbc8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_TestFundElementsUtxoVector_*,_std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>_>
                             *)in_stack_ffffffffffffdbd0,
                            (__normal_iterator<const_TestFundElementsUtxoVector_*,_std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>_>
                             *)in_stack_ffffffffffffdbc8), bVar2) {
    local_6b8 = __gnu_cxx::
                __normal_iterator<const_TestFundElementsUtxoVector_*,_std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>_>
                ::operator*(&local_6a8);
    cfd::core::Txid::Txid(&local_6d8);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      cfd::core::Txid::Txid(&local_6f8,(string *)local_6b8);
      cfd::core::Txid::operator=(&local_6d8,&local_6f8);
      cfd::core::Txid::~Txid((Txid *)0x287755);
    }
    cfd::core::Txid::Txid(&local_718,(string *)local_6b8);
    pvVar4 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                       (&local_620,(ulong)local_698);
    cfd::core::Txid::operator=((Txid *)(pvVar4 + 0x28),&local_718);
    cfd::core::Txid::~Txid((Txid *)0x287880);
    uVar1 = local_6b8->vout;
    pvVar4 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                       (&local_620,(ulong)local_698);
    *(uint32_t *)(pvVar4 + 0x48) = uVar1;
    cfd::core::Amount::Amount((Amount *)&local_728,local_6b8->amount);
    pvVar4 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                       (&local_620,(ulong)local_698);
    pvVar4[0x260] = local_720;
    *(undefined8 *)(pvVar4 + 600) = local_728;
    cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_750,(string *)&local_6b8->asset);
    pvVar4 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                       (&local_620,(ulong)local_698);
    cfd::core::ConfidentialAssetId::operator=((ConfidentialAssetId *)(pvVar4 + 0x278),&local_750);
    cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x287956);
    psVar5 = &local_6b8->descriptor;
    pvVar4 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                       (&local_620,(ulong)local_698);
    std::__cxx11::string::operator=((string *)(pvVar4 + 0x238),(string *)psVar5);
    local_698 = local_698 + 1;
    cfd::core::Txid::~Txid((Txid *)0x2879b7);
    __gnu_cxx::
    __normal_iterator<const_TestFundElementsUtxoVector_*,_std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>_>
    ::operator++(&local_6a8);
  }
  local_50 = 1;
  local_4f = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_790,"57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f",&local_791
            );
  cfd::core::Txid::Txid(&local_770,local_790);
  cfd::core::Txid::operator=(&local_518,&local_770);
  cfd::core::Txid::~Txid((Txid *)0x287a9d);
  std::__cxx11::string::~string(local_790);
  std::allocator<char>::~allocator((allocator<char> *)&local_791);
  local_4f8 = 1;
  std::__cxx11::string::operator=(local_308,local_690);
  local_2d0 = 0;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_7c0,local_668);
  cfd::core::ConfidentialAssetId::operator=(local_2c8,&local_7c0);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x287b20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_800,"0b8954757234fd3ec9cf0dd6ef0a89d825ec56a9532e7da4b6cb90c51be3bbd8",&local_801
            );
  cfd::core::BlindFactor::BlindFactor(&local_7e0,local_800);
  cfd::core::BlindFactor::operator=(&local_f0,&local_7e0);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x287b8e);
  std::__cxx11::string::~string(local_800);
  std::allocator<char>::~allocator((allocator<char> *)&local_801);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_848,"62e36e1f0fa4916b031648a6b6903083069fa587572a88b729250cde528cfd3b",&local_849
            );
  cfd::core::BlindFactor::BlindFactor(&local_828,local_848);
  cfd::core::BlindFactor::operator=(local_d0,&local_828);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x287c16);
  std::__cxx11::string::~string(local_848);
  std::allocator<char>::~allocator((allocator<char> *)&local_849);
  cfd::core::Amount::Amount((Amount *)&local_860,700000000);
  local_2e0 = local_858;
  local_2e8 = local_860;
  local_2d8 = 3;
  cfd::ConfidentialTransactionContext::AddInput((UtxoData *)local_5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_9f8,"2djHX9wtrtdyGw9cer1u6zB6Yq4SRD8V5zw",(allocator *)(local_a10 + 0x17));
  cfd::AddressFactory::GetAddress(local_9d8);
  std::__cxx11::string::~string(local_9f8);
  std::allocator<char>::~allocator((allocator<char> *)(local_a10 + 0x17));
  cfd::core::Amount::Amount((Amount *)local_a10,700000000);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)(local_a50 + 0x18),local_668);
  cfd::ConfidentialTransactionContext::AddTxOut
            ((Address *)local_5f8,(Amount *)local_9d8,(ConfidentialAssetId *)local_a10);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x287d4f);
  cfd::IssuanceOutputParameter::IssuanceOutputParameter
            ((IssuanceOutputParameter *)in_stack_ffffffffffffdbf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f48,"2dodsWJgP3pTWWidK5hDxuYHqC1U4CEnT3n",&local_f49);
  cfd::AddressFactory::GetAddress(local_f28);
  cfd::core::Address::operator=((Address *)local_db0,(Address *)local_f28);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffdbd0);
  std::__cxx11::string::~string(local_f48);
  std::allocator<char>::~allocator((allocator<char> *)&local_f49);
  cfd::core::Amount::Amount((Amount *)local_f60,600000000);
  local_a50[8] = local_f60[1]._0_1_;
  local_a50._0_8_ = local_f60[0];
  cfd::core::OutPoint::OutPoint((OutPoint *)local_ff8,&local_518,local_4f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1038,"6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306",
             &local_1039);
  cfd::core::BlindFactor::BlindFactor(&local_1018,local_1038);
  cfd::ConfidentialTransactionContext::SetAssetReissuance
            ((OutPoint *)(local_ff8 + 0x28),(Amount *)local_5f8,(IssuanceOutputParameter *)local_ff8
             ,(BlindFactor *)local_a50,local_db0);
  cfd::core::IssuanceParameter::~IssuanceParameter((IssuanceParameter *)in_stack_ffffffffffffdbd0);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x287f07);
  std::__cxx11::string::~string(local_1038);
  std::allocator<char>::~allocator((allocator<char> *)&local_1039);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x287f2e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_10d0,
             "xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy"
             ,&local_10d1);
  cfd::core::ExtPubkey::ExtPubkey(&local_10b0,local_10d0);
  std::__cxx11::string::~string(local_10d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_10d1);
  cfd::core::ExtPubkey::DerivePubkey((uint)local_12d8);
  cfd::core::ExtPubkey::GetPubkey();
  cfd::AddressFactory::CreateP2wpkhAddress(local_1250);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x287ff1);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_ffffffffffffdbd0);
  cfd::core::ExtPubkey::DerivePubkey((int)local_14e8 + 0x10);
  cfd::core::ExtPubkey::GetPubkey();
  cfd::AddressFactory::CreateP2wpkhAddress(local_1450);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x28805d);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_ffffffffffffdbd0);
  cfd::core::Amount::Amount((Amount *)(local_14f8 + 0x10),10000000);
  cfd::ConfidentialTransactionContext::AddTxOut
            ((Address *)local_5f8,(Amount *)local_1250,(ConfidentialAssetId *)(local_14f8 + 0x10));
  cfd::core::Amount::Amount((Amount *)local_14f8,500000);
  cfd::ConfidentialTransactionContext::AddTxOut
            ((Address *)local_5f8,(Amount *)local_1450,(ConfidentialAssetId *)local_14f8);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_1520,&exp_dummy_asset_a);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
         *)0x288101);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  cfd::core::Amount::Amount(local_1580,0);
  pVar9 = std::
          map<std::__cxx11::string,cfd::core::Amount,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
          ::emplace<std::__cxx11::string,cfd::core::Amount>
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
                      *)in_stack_ffffffffffffdbe0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8),
                     (Amount *)in_stack_ffffffffffffdbd0);
  local_1590 = (_Base_ptr)pVar9.first._M_node;
  local_1588 = pVar9.second;
  std::__cxx11::string::~string(local_1570);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  cfd::core::Amount::Amount(local_15c0,0);
  pVar9 = std::
          map<std::__cxx11::string,cfd::core::Amount,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
          ::emplace<std::__cxx11::string,cfd::core::Amount>
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
                      *)in_stack_ffffffffffffdbe0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8),
                     (Amount *)in_stack_ffffffffffffdbd0);
  local_15d0 = (_Base_ptr)pVar9.first._M_node;
  local_15c8 = pVar9.second;
  std::__cxx11::string::~string(local_15b0);
  cfd::core::ExtPubkey::DerivePubkey((uint)local_17d0);
  cfd::core::ExtPubkey::GetPubkey();
  cfd::AddressFactory::CreateP2wpkhAddress(local_1748);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x288264);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_ffffffffffffdbd0);
  cfd::core::ExtPubkey::DerivePubkey((uint)local_19d0);
  cfd::core::ExtPubkey::GetPubkey();
  cfd::AddressFactory::CreateP2wpkhAddress(local_1948);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2882d0);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_ffffffffffffdbd0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x2882ea);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  cfd::core::Address::GetAddress_abi_cxx11_();
  pVar10 = std::
           map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::emplace<std::__cxx11::string,std::__cxx11::string>
                     ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_ffffffffffffdbe0,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffffdbd0);
  local_1a50 = (_Base_ptr)pVar10.first._M_node;
  local_1a48 = pVar10.second;
  std::__cxx11::string::~string(local_1a40);
  std::__cxx11::string::~string(local_1a20);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  cfd::core::Address::GetAddress_abi_cxx11_();
  pVar10 = std::
           map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::emplace<std::__cxx11::string,std::__cxx11::string>
                     ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_ffffffffffffdbe0,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffffdbd0);
  local_1ab8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pVar10.first._M_node;
  local_1ab8.version_ = pVar10.second;
  std::__cxx11::string::~string(local_1a90);
  std::__cxx11::string::~string(local_1a70);
  local_2008 = local_2000;
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption
            (in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
  local_1ac8 = local_2000;
  local_1ac0 = 1;
  std::allocator<cfd::api::ElementsUtxoAndOption>::allocator
            ((allocator<cfd::api::ElementsUtxoAndOption> *)0x288460);
  __l._M_len = in_stack_ffffffffffffdc10;
  __l._M_array = in_stack_ffffffffffffdc08;
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
          *)CONCAT44(in_stack_ffffffffffffdc04,in_stack_ffffffffffffdc00),__l,
         in_stack_ffffffffffffdbf8);
  std::allocator<cfd::api::ElementsUtxoAndOption>::~allocator
            ((allocator<cfd::api::ElementsUtxoAndOption> *)0x288494);
  local_2330 = (undefined1 ****)&local_1ac8;
  do {
    local_2330 = local_2330 + -0xa7;
    cfd::api::ElementsUtxoAndOption::~ElementsUtxoAndOption(in_stack_ffffffffffffdbd0);
  } while (local_2330 != local_2000);
  local_2018 = 0.1;
  cfd::core::Amount::Amount(local_2028);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x288519);
  cfd::CoinSelectionOption::CoinSelectionOption((CoinSelectionOption *)local_20b0);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo();
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate(local_2018);
  cfd::CoinSelectionOption::SetLongTermFeeBaserate(local_2018);
  cfd::CoinSelectionOption::SetFeeAsset(local_20b0);
  cfd::api::ElementsTransactionApi::ElementsTransactionApi(&local_20b1);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  lhs_expression = local_202c;
  this_01 = (CoinSelectionOption *)local_2028;
  this_00 = (ElementsUtxoAndOption *)local_1520;
  uVar11 = 1;
  cfd::api::ElementsTransactionApi::FundRawTransaction
            (local_2108,(vector *)&local_20b1,local_2128,(vector *)&local_620,local_1550,&local_1ab8
             ,false,local_2018,(Amount *)this_00,(UtxoFilter *)CONCAT44(in_stack_ffffffffffffdbdc,1)
             ,this_01,lhs_expression,(NetType)local_20b0,(vector *)&local_2048,
             (Amount *)CONCAT44(in_stack_ffffffffffffdc04,4));
  std::__cxx11::string::~string((string *)local_2128);
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_2138,"kExpTxData","ctx.GetHex().c_str()",
             "0200000000030f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c34600000bfa8774c5f753ce2f801a8106413b470af94edbff5b4242ed4c5a26d20e72b90000000000ffffffff040b0000000000000000000000000000000000000000000000000000000000000000000000ffffffff07010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b92700001976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac01cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c34600001976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac0100000000000000000000000000000000000000000000000000000000000000aa010000000000989680001600144352a1a6e86311f22274f7ebb2746de21b09b15d0100000000000000000000000000000000000000000000000000000000000000bb01000000000007a120001600148beaaac4654cf4ebd8e46ca5062b0e7fb3e7470c0100000000000000000000000000000000000000000000000000000000000000aa01000000000000036800000100000000000000000000000000000000000000000000000000000000000000bb010000000001124c1e00160014a53be40113bb50f2b8b2d0bfea1e823e75632b5f0100000000000000000000000000000000000000000000000000000000000000aa0100000000004b57f60016001478eb9fc2c9e1cdf633ecb646858ba862b21384ab00000000"
             ,pcVar6);
  std::__cxx11::string::~string(local_2158);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2138);
  if (!bVar2) {
    testing::Message::Message(&local_2160);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x288e86);
    testing::internal::AssertHelper::AssertHelper
              (&local_2168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x275,pcVar6);
    testing::internal::AssertHelper::operator=(&local_2168,&local_2160);
    testing::internal::AssertHelper::~AssertHelper(&local_2168);
    testing::Message::~Message((Message *)0x288ee9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x288f41);
  local_217c = 0x368;
  local_2188 = cfd::core::Amount::GetSatoshiValue();
  testing::internal::EqHelper<false>::Compare<int,long>
            ((char *)lhs_expression,(char *)this_01,
             (int *)CONCAT44(in_stack_ffffffffffffdbdc,uVar11),(long *)this_00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2178);
  if (!bVar2) {
    testing::Message::Message(&local_2190);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x28900f);
    testing::internal::AssertHelper::AssertHelper
              (&local_2198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x276,pcVar6);
    testing::internal::AssertHelper::operator=(&local_2198,&local_2190);
    testing::internal::AssertHelper::~AssertHelper(&local_2198);
    testing::Message::~Message((Message *)0x289072);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2890ca);
  local_21b0 = 2;
  local_21b8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(&local_2048);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((char *)lhs_expression,(char *)this_01,
             (unsigned_long *)CONCAT44(in_stack_ffffffffffffdbdc,uVar11),(unsigned_long *)this_00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_21a8);
  if (!bVar2) {
    testing::Message::Message(&local_21c0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x289187);
    testing::internal::AssertHelper::AssertHelper
              (&local_21c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x278,pcVar6);
    testing::internal::AssertHelper::operator=(&local_21c8,&local_21c0);
    testing::internal::AssertHelper::~AssertHelper(&local_21c8);
    testing::Message::~Message((Message *)0x2891ea);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x289242);
  sVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_2048);
  if (sVar7 == 2) {
    cfd::core::Address::GetAddress_abi_cxx11_();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_2048,1);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_21d8,"addr1.GetAddress().c_str()",
               "append_txout_addresses[1].c_str()",pcVar6,pcVar8);
    std::__cxx11::string::~string(local_21f8);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_21d8);
    if (!bVar2) {
      testing::Message::Message(&local_2200);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x289369);
      testing::internal::AssertHelper::AssertHelper
                (&local_2208,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x27b,pcVar6);
      testing::internal::AssertHelper::operator=(&local_2208,&local_2200);
      testing::internal::AssertHelper::~AssertHelper(&local_2208);
      testing::Message::~Message((Message *)0x2893c6);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x28941e);
    cfd::core::Address::GetAddress_abi_cxx11_();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_2048,0);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_2218,"addr2.GetAddress().c_str()",
               "append_txout_addresses[0].c_str()",pcVar6,pcVar8);
    std::__cxx11::string::~string(local_2238);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2218);
    if (!bVar2) {
      testing::Message::Message(&local_2240);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x289521);
      testing::internal::AssertHelper::AssertHelper
                (&local_2248,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x27c,pcVar6);
      testing::internal::AssertHelper::operator=(&local_2248,&local_2240);
      testing::internal::AssertHelper::~AssertHelper(&local_2248);
      testing::Message::~Message((Message *)0x28957e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2895d3);
  }
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController
            ((ConfidentialTransactionController *)this_00);
  cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x289601);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_01);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
           *)this_01);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x289628);
  cfd::core::Address::~Address((Address *)this_00);
  cfd::core::Address::~Address((Address *)this_00);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
          *)0x28964f);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x28965c);
  cfd::core::Address::~Address((Address *)this_00);
  cfd::core::Address::~Address((Address *)this_00);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)this_00);
  cfd::IssuanceOutputParameter::~IssuanceOutputParameter((IssuanceOutputParameter *)this_00);
  cfd::core::Address::~Address((Address *)this_00);
  std::__cxx11::string::~string(local_690);
  std::__cxx11::string::~string(local_668);
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x28994f);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)this_01);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)this_00);
  cfd::api::ElementsUtxoAndOption::~ElementsUtxoAndOption(this_00);
  return;
}

Assistant:

TEST(ElementsTransactionApi, FundRawTransaction_Reissueasset) {
  static const char* const kExpTxData = "0200000000030f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c34600000bfa8774c5f753ce2f801a8106413b470af94edbff5b4242ed4c5a26d20e72b90000000000ffffffff040b0000000000000000000000000000000000000000000000000000000000000000000000ffffffff07010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b92700001976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac01cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c34600001976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac0100000000000000000000000000000000000000000000000000000000000000aa010000000000989680001600144352a1a6e86311f22274f7ebb2746de21b09b15d0100000000000000000000000000000000000000000000000000000000000000bb01000000000007a120001600148beaaac4654cf4ebd8e46ca5062b0e7fb3e7470c0100000000000000000000000000000000000000000000000000000000000000aa01000000000000036800000100000000000000000000000000000000000000000000000000000000000000bb010000000001124c1e00160014a53be40113bb50f2b8b2d0bfea1e823e75632b5f0100000000000000000000000000000000000000000000000000000000000000aa0100000000004b57f60016001478eb9fc2c9e1cdf633ecb646858ba862b21384ab00000000";

  ElementsUtxoAndOption input_utxo;
  ConfidentialTransactionContext tx(uint32_t{2}, uint32_t{0});
  std::vector<UtxoData> utxos;
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  std::string tokenAsset = "ed6927df918c89b5e3d8b5062acab2c749a3291bb7451d4267c7daaf1b52ad0b";
  std::string descMulti = "wsh(multi(2,03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7,03774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a))";

  try {
    utxos.resize(kFundCoinSelectElementsTestVector.size());
    uint32_t i = 0;
    for (const auto& test_data : kFundCoinSelectElementsTestVector) {
      Txid txid;
      if (!test_data.txid.empty()) {
        txid = Txid(test_data.txid);
      }
      utxos[i].txid = Txid(test_data.txid);
      utxos[i].vout = test_data.vout;
      utxos[i].amount = Amount(test_data.amount);
      utxos[i].asset = ConfidentialAssetId(test_data.asset);
      utxos[i].descriptor = test_data.descriptor;
      ++i;
    }

    // create reissue tx
    input_utxo.is_issuance = true;
    input_utxo.is_blind_issuance = true;
    input_utxo.utxo.txid = Txid("57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f");
    input_utxo.utxo.vout = 1;
    input_utxo.utxo.descriptor = descMulti;
    input_utxo.utxo.binary_data = nullptr;
    input_utxo.utxo.asset = ConfidentialAssetId(tokenAsset);
    input_utxo.utxo.asset_blind_factor =
      BlindFactor("0b8954757234fd3ec9cf0dd6ef0a89d825ec56a9532e7da4b6cb90c51be3bbd8");
    input_utxo.utxo.amount_blind_factor =
      BlindFactor("62e36e1f0fa4916b031648a6b6903083069fa587572a88b729250cde528cfd3b");
    input_utxo.utxo.amount = Amount(int64_t{700000000});
    input_utxo.utxo.address_type = AddressType::kP2wshAddress;
    tx.AddInput(input_utxo.utxo);

    Address addr = factory.GetAddress("2djHX9wtrtdyGw9cer1u6zB6Yq4SRD8V5zw");
    tx.AddTxOut(addr, Amount(int64_t{700000000}), ConfidentialAssetId(tokenAsset));
    IssuanceOutputParameter reissue_data;
    reissue_data.address = factory.GetAddress("2dodsWJgP3pTWWidK5hDxuYHqC1U4CEnT3n");
    reissue_data.amount =  Amount(int64_t{600000000});
    // IssuanceParameter issue;
    tx.SetAssetReissuance(
        OutPoint(input_utxo.utxo.txid, input_utxo.utxo.vout), reissue_data.amount,
        reissue_data, input_utxo.utxo.asset_blind_factor,
        BlindFactor("6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306"));
    // output.WriteLine("issue asset: " + issueAsset.ToHexString());

    // add txout
    ExtPubkey key = ExtPubkey("xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy");
    Address set_addr1 = factory.CreateP2wpkhAddress(key.DerivePubkey(11).GetPubkey());
    Address set_addr2 = factory.CreateP2wpkhAddress(key.DerivePubkey(12).GetPubkey());
    tx.AddTxOut(set_addr1, Amount(int64_t{10000000}), exp_dummy_asset_a);
    tx.AddTxOut(set_addr2, Amount(int64_t{500000}), exp_dummy_asset_b);

    ConfidentialAssetId fee_asset = exp_dummy_asset_a;
    std::map<std::string, Amount> map_target_value;
    map_target_value.emplace(exp_dummy_asset_a.GetHex(), Amount(int64_t{0}));
    map_target_value.emplace(exp_dummy_asset_b.GetHex(), Amount(int64_t{0}));
    Address addr1 = factory.CreateP2wpkhAddress(key.DerivePubkey(1).GetPubkey());
    Address addr2 = factory.CreateP2wpkhAddress(key.DerivePubkey(2).GetPubkey());
    std::map<std::string, std::string> reserve_txout_address;
    reserve_txout_address.emplace(exp_dummy_asset_a.GetHex(), addr1.GetAddress());
    reserve_txout_address.emplace(exp_dummy_asset_b.GetHex(), addr2.GetAddress());
    std::vector<ElementsUtxoAndOption> selected_txin_utxos = {input_utxo};
    double fee_rate = 0.1;
    Amount estimate_fee;
    UtxoFilter filter;
    std::vector<std::string> append_txout_addresses;
    CoinSelectionOption option;
    option.InitializeConfidentialTxSizeInfo();
    option.SetEffectiveFeeBaserate(fee_rate);
    option.SetLongTermFeeBaserate(fee_rate);
    option.SetFeeAsset(fee_asset);
    // option.SetBlindInfo(0, 36);

    ElementsTransactionApi api;
    ConfidentialTransactionController ctx = api.FundRawTransaction(
        tx.GetHex(), utxos, map_target_value, selected_txin_utxos,
        reserve_txout_address, fee_asset, true, fee_rate, &estimate_fee,
        &filter, &option, &append_txout_addresses, NetType::kElementsRegtest);

    EXPECT_STREQ(kExpTxData, ctx.GetHex().c_str());
    EXPECT_EQ(872, estimate_fee.GetSatoshiValue());
    // EXPECT_EQ(657, estimate_fee.GetSatoshiValue());
    EXPECT_EQ(size_t{2}, append_txout_addresses.size());
    if (append_txout_addresses.size() == size_t{2})
    {
      EXPECT_STREQ(addr1.GetAddress().c_str(), append_txout_addresses[1].c_str());
      EXPECT_STREQ(addr2.GetAddress().c_str(), append_txout_addresses[0].c_str());
    }
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    return;
  }
}